

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

char * __thiscall GenericModel::index(GenericModel *this,char *__s,int __c)

{
  int iVar1;
  GenericModelPrivate *this_00;
  GenericModelItem *pGVar2;
  int in_ECX;
  QModelIndex *in_R8;
  GenericModelItem *parentItem;
  GenericModelPrivate *d;
  QModelIndex *parent_local;
  int column_local;
  int row_local;
  GenericModel *this_local;
  
  if ((__c < 0) || (in_ECX < 0)) {
    QModelIndex::QModelIndex((QModelIndex *)this);
  }
  else {
    this_00 = d_func((GenericModel *)__s);
    pGVar2 = GenericModelPrivate::itemForIndex(this_00,in_R8);
    iVar1 = GenericModelItem::rowCount(pGVar2);
    if ((__c < iVar1) && (iVar1 = GenericModelItem::columnCount(pGVar2), in_ECX < iVar1)) {
      pGVar2 = GenericModelItem::childAt(pGVar2,__c,in_ECX);
      QAbstractItemModel::createIndex
                ((QModelIndex *)this,(QAbstractItemModel *)__s,__c,in_ECX,pGVar2);
      return (char *)this;
    }
    QModelIndex::QModelIndex((QModelIndex *)this);
  }
  return (char *)this;
}

Assistant:

QModelIndex GenericModel::index(int row, int column, const QModelIndex &parent) const
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (row < 0 || column < 0)
        return QModelIndex();
    Q_D(const GenericModel);
    GenericModelItem *parentItem = d->itemForIndex(parent);
    if (row >= parentItem->rowCount() || column >= parentItem->columnCount())
        return QModelIndex();
    return createIndex(row, column, parentItem->childAt(row, column));
}